

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.h
# Opt level: O1

bool __thiscall cmWorkerPool::EmplaceJob<cmQtAutoMocUic::JobFinishT>(cmWorkerPool *this)

{
  bool bVar1;
  __uniq_ptr_impl<cmWorkerPool::JobT,_std::default_delete<cmWorkerPool::JobT>_> local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
  super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl =
       (tuple<cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>)operator_new(0x18);
  *(long *)local_10._M_t.
           super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
           super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl = 0;
  *(long *)((long)local_10._M_t.
                  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                  .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_10._M_t.
                  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                  .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)local_10._M_t.
                  super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                  .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 8) = 0;
  *(undefined4 *)
   ((long)local_10._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined1 *)
   ((long)local_10._M_t.
          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
          super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 0x14) = 1;
  *(undefined ***)
   local_10._M_t.
   super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
   super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl = &PTR__JobT_00673b98;
  bVar1 = PushJob(this,(JobHandleT *)&local_10);
  if ((_Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>)
      local_10._M_t.
      super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>.
      super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl != (JobT *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_cmWorkerPool::JobT_*,_std::default_delete<cmWorkerPool::JobT>_>
                          .super__Head_base<0UL,_cmWorkerPool::JobT_*,_false>._M_head_impl + 8))();
  }
  return bVar1;
}

Assistant:

bool EmplaceJob(Args&&... args)
  {
    return PushJob(cm::make_unique<T>(std::forward<Args>(args)...));
  }